

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superenalotto.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  result_type __sd;
  ostream *poVar2;
  const_iterator piVar3;
  iterator iVar4;
  iterator iVar5;
  reference piVar6;
  int *j;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int i;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 local_13e8;
  undefined4 local_13e4;
  initializer_list<int> local_13e0;
  initializer_list<int> *local_13d0;
  initializer_list<int> *__range1;
  allocator<int> local_13b1;
  undefined1 local_13b0 [8];
  vector<int,_std::allocator<int>_> gigi;
  mt19937 mt_rand;
  
  __sd = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,__sd);
  std::allocator<int>::allocator(&local_13b1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_13b0,6,&local_13b1);
  std::allocator<int>::~allocator(&local_13b1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Numeri Superenalotto");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __begin1._0_4_ = 0;
  __begin1._4_4_ = 0;
  local_13e8 = 0;
  local_13e4 = 0;
  local_13e0._M_array = (iterator)&__begin1;
  local_13e0._M_len = 4;
  local_13d0 = &local_13e0;
  __end1 = std::initializer_list<int>::begin(local_13d0);
  piVar3 = std::initializer_list<int>::end(local_13d0);
  for (; __end1 != piVar3; __end1 = __end1 + 1) {
    iVar4 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_13b0);
    iVar5 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_13b0);
    std::generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,main::__0>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
               (anon_class_8_1_d4c39a9d)
               &gigi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    iVar4 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_13b0);
    iVar5 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_13b0);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current);
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_13b0);
    j = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_13b0);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&j);
      if (!bVar1) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
      std::operator<<(poVar2," ");
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_13b0);
  return 0;
}

Assistant:

int main() {
    std::mt19937 mt_rand(time(0));
    std::vector<int> gigi(6);

    std::cout << "Numeri Superenalotto" << std::endl;

    for (auto i : {0,0,0,0})
    {
        std::generate (gigi.begin(), gigi.end(), [&mt_rand] { return (mt_rand() % 90) + 1; });
        std::sort (gigi.begin(), gigi.end());
        for (auto& j : gigi)
        {
            std::cout << j << " ";
        }
        std::cout << std::endl;
    }
}